

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test::
~GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test
          (GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test *this)

{
  (this->super_GeneratedMessageReflectionCordAccessorsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__GeneratedMessageReflectionCordAccessorsTest_0189a6b8;
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            (&(this->super_GeneratedMessageReflectionCordAccessorsTest).extensions_message_);
  proto2_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_GeneratedMessageReflectionCordAccessorsTest).message_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,1000);
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, GetOneofCord) {
  unittest::TestOneof2 message;
  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = message.GetReflection();

  message.set_foo_bytes_cord("bytes_cord");
  EXPECT_EQ("bytes_cord",
            reflection->GetCord(message,
                                descriptor->FindFieldByName("foo_bytes_cord")));

  message.set_foo_string("foo");
  EXPECT_EQ("foo", reflection->GetCord(
                       message, descriptor->FindFieldByName("foo_string")));

  message.set_foo_bytes("bytes");
  EXPECT_EQ("bytes", reflection->GetCord(
                         message, descriptor->FindFieldByName("foo_bytes")));

}